

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

void __thiscall
cmCTestCVS::LoadRevisions
          (cmCTestCVS *this,string *file,char *branchFlag,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions)

{
  cmCTest *this_00;
  char *cvs_log [6];
  OutputLogger err;
  LogParser out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  std::operator<<((ostream *)&out,".");
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0xda,(char *)err.super_LineParser.super_OutputParser._vptr_OutputParser,false);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  cvs_log[0] = (this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  cvs_log[1] = "log";
  cvs_log[2] = "-N";
  cvs_log[4] = (file->_M_dataplus)._M_p;
  cvs_log[5] = (char *)0x0;
  cvs_log[3] = branchFlag;
  LogParser::LogParser(&out,this,"log-out> ",revisions);
  cmProcessTools::OutputLogger::OutputLogger(&err,(this->super_cmCTestVC).Log,"log-err> ");
  cmCTestVC::RunChild(&this->super_cmCTestVC,cvs_log,(OutputParser *)&out,(OutputParser *)&err,
                      (char *)0x0,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  LogParser::~LogParser(&out);
  return;
}

Assistant:

void cmCTestCVS::LoadRevisions(std::string const& file, const char* branchFlag,
                               std::vector<Revision>& revisions)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Run "cvs log" to get revisions of this file on this branch.
  const char* cvs = this->CommandLineTool.c_str();
  const char* cvs_log[] = {
    cvs, "log", "-N", branchFlag, file.c_str(), nullptr
  };

  LogParser out(this, "log-out> ", revisions);
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(cvs_log, &out, &err);
}